

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *node)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  _Var4;
  _Head_base<0UL,_verilogAST::Module_*,_false> _Var5;
  long *in_RDX;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *pvVar6;
  pointer *__ptr;
  __index_type *p_Var7;
  undefined8 *puVar8;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  new_body;
  _Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  long *local_b8;
  long *local_b0;
  long *local_a8;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *local_a0;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_98;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_80;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_70;
  variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *local_60;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  local_58;
  _Head_base<0UL,_verilogAST::Module_*,_false> local_38;
  
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar8 = *(undefined8 **)(*in_RDX + 0x28);
  puVar1 = *(undefined8 **)(*in_RDX + 0x30);
  local_a8 = in_RDX;
  local_38._M_head_impl = (Module *)this;
  if (puVar8 != puVar1) {
    do {
      local_b0 = (long *)*puVar8;
      *puVar8 = 0;
      (**(code **)&(node->_M_t).
                   super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                   .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[2].body.
                   super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                   ._M_impl)(&local_d8,node,&local_b0);
      std::
      vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
      ::
      emplace_back<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>
                ((vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
                  *)&local_98,
                 (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                  *)&local_d8._M_first);
      if (local_d8 !=
          (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
           )0x0) {
        (**(code **)(*(long *)local_d8 + 0x10))();
      }
      local_d8 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 0x10))();
      }
      local_b0 = (long *)0x0;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  plVar3 = local_a8;
  lVar2 = *local_a8;
  local_d8 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               *)(lVar2 + 0x28);
  uStack_d0 = *(ulong *)(lVar2 + 0x30);
  local_c8 = *(undefined8 *)(lVar2 + 0x38);
  *(pointer *)(lVar2 + 0x28) =
       local_98.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar2 + 0x30) =
       local_98.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar2 + 0x38) =
       local_98.
       super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
             *)&local_d8._M_first);
  p_Var7 = *(__index_type **)(*plVar3 + 0x58);
  local_a0 = *(variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               **)(*plVar3 + 0x60);
  if ((variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
       *)p_Var7 != local_a0) {
    do {
      local_70.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = p_Var7[8];
      local_58.
      super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_70;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&&>
        ::_S_vtable._M_arr[p_Var7[8]]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_58,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var7);
      (*(code *)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
                _M_t.
                super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[1].name.
                _M_string_length)(&local_d8,node,&local_70);
      local_58.
      super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var7;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[uStack_d0 & 0xff]._M_data)
                ((anon_class_8_1_8991fb9c_conflict1 *)&local_58,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_d8);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[uStack_d0 & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_58,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_d8);
      uStack_d0 = CONCAT71(uStack_d0._1_7_,0xff);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [local_70.
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_58,&local_70);
      local_70.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = 0xff;
      local_b8 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                               *)(p_Var7 + 0x10))->
                            super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                            ).
                            super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            ._M_u;
      (((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         *)(p_Var7 + 0x10))->
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      ).
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_u = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               )0x0;
      (**(code **)(node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                  .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl)
                (&local_d8,node,&local_b8);
      _Var4 = local_d8;
      local_d8 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      plVar3 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                             *)(p_Var7 + 0x10))->
                          super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          ).
                          super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          ._M_u;
      *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
        *)(p_Var7 + 0x10) = _Var4;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))();
      }
      if (local_d8 !=
          (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
           )0x0) {
        (**(code **)(*(long *)local_d8 + 0x10))();
      }
      local_d8 = (_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  )0x0;
      if (local_b8 != (long *)0x0) {
        (**(code **)(*local_b8 + 0x10))();
      }
      local_b8 = (long *)0x0;
      p_Var7 = p_Var7 + 0x18;
    } while ((variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
              *)p_Var7 != local_a0);
  }
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = *(variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
             **)(*local_a8 + 0x40);
  local_a0 = *(variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               **)(*local_a8 + 0x48);
  if (pvVar6 != local_a0) {
    do {
      local_80.
      super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      ._M_index = *(__index_type *)
                   ((long)&(pvVar6->
                           super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                           ).
                           super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                           .
                           super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                           .
                           super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                           .
                           super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                   + 8);
      local_60 = &local_80;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(pvVar6->
                  super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  ).
                  super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                  .
                  super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                  .
                  super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
                  .
                  super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
          + 8)]._M_data)((anon_class_8_1_a78179b7_conflict2 *)&local_60,pvVar6);
      local_60 = (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)node;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST/transformer.hpp:13:9)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr
        [local_80.
         super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         ._M_index]._M_data)
                ((variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_d8,(anon_class_8_1_8991fb9c_conflict4 *)&local_60,&local_80);
      std::
      vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
      ::
      emplace_back<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>
                ((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
                  *)&local_58,
                 (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_d8._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr[uStack_d0 & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_60,
                 (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                  *)&local_d8);
      uStack_d0 = CONCAT71(uStack_d0._1_7_,0xff);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
        ::_S_vtable._M_arr
        [local_80.
         super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_60,&local_80);
      local_80.
      super__Variant_base<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::StructuralStatement>,_std::unique_ptr<verilogAST::Declaration>_>
      ._M_index = 0xff;
      pvVar6 = pvVar6 + 1;
    } while (pvVar6 != local_a0);
  }
  lVar2 = *local_a8;
  local_d8 = *(_Variadic_union<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
               *)(lVar2 + 0x40);
  uStack_d0 = *(undefined8 *)(lVar2 + 0x48);
  local_c8 = *(undefined8 *)(lVar2 + 0x50);
  *(pointer *)(lVar2 + 0x40) =
       local_58.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(lVar2 + 0x48) =
       local_58.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(lVar2 + 0x50) =
       local_58.
       super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
             *)&local_d8._M_first);
  _Var5._M_head_impl = local_38._M_head_impl;
  *(long *)local_38._M_head_impl = *local_a8;
  *local_a8 = 0;
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_98);
  return (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         _Var5._M_head_impl;
}

Assistant:

std::unique_ptr<Module> Transformer::visit(std::unique_ptr<Module> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  std::vector<std::variant<std::unique_ptr<StructuralStatement>,
                           std::unique_ptr<Declaration>>>
      new_body;
  for (auto&& item : node->body) {
    new_body.push_back(this->visit(std::move(item)));
  }
  node->body = std::move(new_body);
  return node;
}